

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void codearith(FuncState *fs,OpCode op,expdesc *e1,expdesc *e2)

{
  int iVar1;
  int iVar2;
  undefined4 *in_RDX;
  int in_ESI;
  expdesc *in_RDI;
  OpCode unaff_retaddr;
  int o1;
  int o2;
  int in_stack_ffffffffffffffc8;
  OpCode in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = constfolding(unaff_retaddr,in_RDI,(expdesc *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (iVar1 == 0) {
    if ((in_ESI == 0x12) || (in_ESI == 0x14)) {
      iVar1 = 0;
    }
    else {
      iVar1 = luaK_exp2RK((FuncState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                          ,(expdesc *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
      ;
    }
    iVar3 = iVar1;
    iVar2 = luaK_exp2RK((FuncState *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
                        (expdesc *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    if (iVar3 < iVar2) {
      freeexp((FuncState *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
              (expdesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      freeexp((FuncState *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
              (expdesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      freeexp((FuncState *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
              (expdesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      freeexp((FuncState *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
              (expdesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    iVar1 = luaK_codeABC((FuncState *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0,0x11606b);
    in_RDX[2] = iVar1;
    *in_RDX = 0xb;
  }
  return;
}

Assistant:

static void codearith(FuncState*fs,OpCode op,expdesc*e1,expdesc*e2){
if(constfolding(op,e1,e2))
return;
else{
int o2=(op!=OP_UNM&&op!=OP_LEN)?luaK_exp2RK(fs,e2):0;
int o1=luaK_exp2RK(fs,e1);
if(o1>o2){
freeexp(fs,e1);
freeexp(fs,e2);
}
else{
freeexp(fs,e2);
freeexp(fs,e1);
}
e1->u.s.info=luaK_codeABC(fs,op,0,o1,o2);
e1->k=VRELOCABLE;
}
}